

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

void jit_profile_callback(lua_State *L2,lua_State *L,int samples,int vmstate)

{
  byte *pbVar1;
  TValue *pTVar2;
  uint64_t uVar3;
  code *pcVar4;
  int iVar5;
  cTValue *pcVar6;
  GCstr *pGVar7;
  char vmst;
  TValue key;
  char local_31;
  cTValue local_30;
  
  local_30.n = -5.03946958758071e-322;
  pcVar6 = lj_tab_get(L,(GCtab *)(*(ulong *)((L->glref).ptr64 + 0x110) & 0x7fffffffffff),&local_30);
  if ((pcVar6->field_4).it >> 0xf == 0x1fff7) {
    local_31 = (char)vmstate;
    pTVar2 = L2->top;
    L2->top = pTVar2 + 1;
    pTVar2->u64 = pcVar6->u64 & 0x7fffffffffff | 0xfffb800000000000;
    pTVar2 = L2->top;
    L2->top = pTVar2 + 1;
    pTVar2->u64 = (ulong)L | 0xfffc800000000000;
    pTVar2 = L2->top;
    L2->top = pTVar2 + 1;
    pTVar2->n = (double)samples;
    pTVar2 = L2->top;
    L2->top = pTVar2 + 1;
    pGVar7 = lj_str_new(L2,&local_31,1);
    pTVar2->u64 = (ulong)pGVar7 | 0xfffd800000000000;
    iVar5 = lua_pcall(L2,3,0,0);
    uVar3 = (L2->glref).ptr64;
    if (iVar5 != 0) {
      pcVar4 = *(code **)(uVar3 + 0x160);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(L2);
      }
      exit(1);
    }
    pbVar1 = (byte *)(uVar3 + 0x3cc);
    *pbVar1 = *pbVar1 & 0xef;
  }
  return;
}

Assistant:

static void jit_profile_callback(lua_State *L2, lua_State *L, int samples,
				 int vmstate)
{
  TValue key;
  cTValue *tv;
  key.u64 = KEY_PROFILE_FUNC;
  tv = lj_tab_get(L, tabV(registry(L)), &key);
  if (tvisfunc(tv)) {
    char vmst = (char)vmstate;
    int status;
    setfuncV(L2, L2->top++, funcV(tv));
    setthreadV(L2, L2->top++, L);
    setintV(L2->top++, samples);
    setstrV(L2, L2->top++, lj_str_new(L2, &vmst, 1));
    status = lua_pcall(L2, 3, 0, 0);  /* callback(thread, samples, vmstate) */
    if (status) {
      if (G(L2)->panic) G(L2)->panic(L2);
      exit(EXIT_FAILURE);
    }
    lj_trace_abort(G(L2));
  }
}